

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_expression.cpp
# Opt level: O2

void __thiscall duckdb::BoundExpression::Serialize(BoundExpression *this,Serializer *serializer)

{
  SerializationException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Cannot serialize bound expression",&local_39);
  SerializationException::SerializationException(this_00,&local_38);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BoundExpression::Serialize(Serializer &serializer) const {
	throw SerializationException("Cannot serialize bound expression");
}